

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O1

int coda_type_set_read_type(coda_type *type,coda_native_type read_type)

{
  coda_type_class cVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (type == (coda_type *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x2b7);
    return -1;
  }
  cVar1 = type->type_class;
  switch((ulong)cVar1) {
  case 0:
    pcVar2 = "record";
    break;
  case 1:
    pcVar2 = "array";
    break;
  case 2:
    if ((uint)read_type < 8) {
LAB_00133c7d:
      type->read_type = read_type;
      return 0;
    }
  default:
switchD_00133c41_default:
    pcVar2 = coda_type_get_native_type_name(read_type);
    if (cVar1 < (coda_special_class|coda_array_class)) {
      pcVar3 = *(char **)(&DAT_001c5ae0 + (ulong)cVar1 * 8);
    }
    else {
      pcVar3 = "unknown";
    }
    coda_set_error(-400,"invalid read type (%s) for %s type",pcVar2,pcVar3);
    return -1;
  case 3:
    if ((read_type & ~coda_native_type_uint8) == coda_native_type_float) goto LAB_00133c7d;
    goto switchD_00133c41_default;
  case 4:
    if ((read_type & ~coda_native_type_uint8) == coda_native_type_char) goto LAB_00133c7d;
    goto switchD_00133c41_default;
  case 5:
    pcVar2 = "raw";
    break;
  case 6:
    pcVar2 = "special";
  }
  coda_set_error(-400,"read type cannot be set explicitly for %s type",pcVar2);
  return -1;
}

Assistant:

int coda_type_set_read_type(coda_type *type, coda_native_type read_type)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    switch (type->type_class)
    {
        case coda_record_class:
        case coda_array_class:
        case coda_raw_class:
        case coda_special_class:
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "read type cannot be set explicitly for %s type",
                           coda_type_get_class_name(type->type_class));
            return -1;
        case coda_integer_class:
            if (read_type == coda_native_type_int8 || read_type == coda_native_type_uint8 ||
                read_type == coda_native_type_int16 || read_type == coda_native_type_uint16 ||
                read_type == coda_native_type_int32 || read_type == coda_native_type_uint32 ||
                read_type == coda_native_type_int64 || read_type == coda_native_type_uint64)
            {
                type->read_type = read_type;
                return 0;
            }
            break;
        case coda_real_class:
            if (read_type == coda_native_type_float || read_type == coda_native_type_double)
            {
                type->read_type = read_type;
                return 0;
            }
            break;
        case coda_text_class:
            if (read_type == coda_native_type_char || read_type == coda_native_type_string)
            {
                type->read_type = read_type;
                return 0;
            }
            break;
    }

    coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid read type (%s) for %s type",
                   coda_type_get_native_type_name(read_type), coda_type_get_class_name(type->type_class));
    return -1;
}